

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void discordpp::from_json(json *j,ReadyEvent *t)

{
  bool bVar1;
  const_reference pvVar2;
  ReadyEvent *t_local;
  json *j_local;
  
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[2],_0>(j,(char (*) [2])0x34490f);
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[2],_0>(j,(char (*) [2])0x34490f);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_to<discordpp::field<int>,_0>(pvVar2,&t->v);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[5],_0>(j,(char (*) [5])0x33a9ec);
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[5],_0>(j,(char (*) [5])0x33a9ec);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_to<discordpp::field<discordpp::User>,_0>(pvVar2,&t->user);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[7],_0>(j,(char (*) [7])"guilds");
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[7],_0>(j,(char (*) [7])"guilds");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_to<discordpp::field<std::vector<discordpp::Guild,_std::allocator<discordpp::Guild>_>_>,_0>
              (pvVar2,&t->guilds);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[11],_0>(j,(char (*) [11])"session_id");
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[11],_0>(j,(char (*) [11])"session_id");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    get_to<discordpp::field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
              (pvVar2,&t->session_id);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[19],_0>(j,(char (*) [19])"resume_gateway_url");
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[19],_0>(j,(char (*) [19])"resume_gateway_url");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    get_to<discordpp::field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
              (pvVar2,&t->resume_gateway_url);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[6],_0>(j,(char (*) [6])"shard");
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[6],_0>(j,(char (*) [6])"shard");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_to<discordpp::omittable_field<std::array<int,_2UL>_>,_0>(pvVar2,&t->shard);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[12],_0>(j,(char (*) [12])"application");
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[12],_0>(j,(char (*) [12])"application");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_to<discordpp::field<discordpp::Application>,_0>(pvVar2,&t->application);
  }
  return;
}

Assistant:

void from_json(const nlohmann::json &j, ReadyEvent &t) {
        if(j.contains("v")){j.at("v").get_to(t.v);}
        if(j.contains("user")){j.at("user").get_to(t.user);}
        if(j.contains("guilds")){j.at("guilds").get_to(t.guilds);}
        if(j.contains("session_id")){j.at("session_id").get_to(t.session_id);}
        if(j.contains("resume_gateway_url")){j.at("resume_gateway_url").get_to(t.resume_gateway_url);}
        if(j.contains("shard")){j.at("shard").get_to(t.shard);}
        if(j.contains("application")){j.at("application").get_to(t.application);}
    }